

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::StringColumnReader::Plain
          (StringColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,idx_t num_values,
          idx_t result_offset,Vector *result)

{
  NotImplementedException *this_00;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"StringColumnReader can only read plain data from a shared buffer",
             "");
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Plain(ByteBuffer &plain_data, uint8_t *defines, idx_t num_values, idx_t result_offset,
	           Vector &result) override {
		throw NotImplementedException("StringColumnReader can only read plain data from a shared buffer");
	}